

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O3

uint8_t * google::protobuf::internal::
          MapEntryFuncs<unsigned_int,_proto2_unittest::Proto2MapEnumPlusExtra,_(google::protobuf::internal::WireFormatLite::FieldType)13,_(google::protobuf::internal::WireFormatLite::FieldType)14>
          ::InternalSerialize(int field_number,uint *key,Proto2MapEnumPlusExtra *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  Proto2MapEnumPlusExtra PVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  byte *pbVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar8 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar7 = (uint)uVar8;
      *ptr = (byte)uVar8 | 0x80;
      uVar8 = uVar8 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar7);
  }
  *ptr = (byte)uVar8;
  iVar3 = 0x1f;
  if ((*key | 1) != 0) {
    for (; (*key | 1) >> iVar3 == 0; iVar3 = iVar3 + -1) {
    }
  }
  lVar4 = 0x3f;
  if (((long)(int)*value | 1U) != 0) {
    for (; ((long)(int)*value | 1U) >> lVar4 == 0; lVar4 = lVar4 + -1) {
    }
  }
  ptr[1] = (char)((int)lVar4 * 9 + 0x49U >> 6) + (char)(iVar3 * 9 + 0x49U >> 6) + 2;
  pbVar5 = ptr + 2;
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  uVar7 = *key;
  *pbVar5 = 8;
  pbVar5 = pbVar5 + 1;
  uVar6 = uVar7;
  if (0x7f < uVar7) {
    do {
      *pbVar5 = (byte)uVar6 | 0x80;
      uVar7 = uVar6 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar2 = 0x3fff < uVar6;
      uVar6 = uVar7;
    } while (bVar2);
  }
  *pbVar5 = (byte)uVar7;
  pbVar5 = pbVar5 + 1;
  PVar1 = *value;
  uVar8 = (ulong)(int)PVar1;
  if (stream->end_ <= pbVar5) {
    pbVar5 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar5);
  }
  *pbVar5 = 0x10;
  pbVar5 = pbVar5 + 1;
  uVar9 = uVar8;
  if (0x7f < PVar1) {
    do {
      *pbVar5 = (byte)uVar9 | 0x80;
      uVar8 = uVar9 >> 7;
      pbVar5 = pbVar5 + 1;
      bVar2 = 0x3fff < uVar9;
      uVar9 = uVar8;
    } while (bVar2);
  }
  *pbVar5 = (byte)uVar8;
  return pbVar5 + 1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }